

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  long lVar1;
  undefined1 uVar2;
  qsizetype qVar3;
  long in_RSI;
  QArrayDataPointer<QItemSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QItemSelectionRange tmp;
  QItemSelectionRange *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar4;
  Inserter *in_stack_ffffffffffffff90;
  GrowthPosition in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa4;
  byte bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QArrayDataPointer<QItemSelectionRange>::needsDetach
                    ((QArrayDataPointer<QItemSelectionRange> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QItemSelectionRange>::end
                ((QArrayDataPointer<QItemSelectionRange> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0083fa5d;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QItemSelectionRange>::begin
                ((QArrayDataPointer<QItemSelectionRange> *)0x83f8fa);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0083fa5d;
    }
  }
  QItemSelectionRange::QItemSelectionRange
            ((QItemSelectionRange *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  uVar4 = in_RDI->size != 0 && in_RSI == 0;
  bVar5 = uVar4;
  QArrayDataPointer<QItemSelectionRange>::detachAndGrow
            ((QArrayDataPointer<QItemSelectionRange> *)
             CONCAT17(uVar2,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffffa4,(uint)(byte)uVar4))),
             in_stack_ffffffffffffff9c,(qsizetype)in_stack_ffffffffffffff90,
             (QItemSelectionRange **)in_RDI,
             (QArrayDataPointer<QItemSelectionRange> *)CONCAT17(uVar4,in_stack_ffffffffffffff80));
  if ((bVar5 & 1) == 0) {
    Inserter::Inserter(in_stack_ffffffffffffff90,in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffff80),
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne((Inserter *)CONCAT17(uVar4,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar4,in_stack_ffffffffffffff80));
  }
  else {
    QArrayDataPointer<QItemSelectionRange>::begin
              ((QArrayDataPointer<QItemSelectionRange> *)0x83f9b9);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT17(uVar4,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QItemSelectionRange::~QItemSelectionRange
            ((QItemSelectionRange *)CONCAT17(uVar4,in_stack_ffffffffffffff80));
LAB_0083fa5d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }